

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O2

int __thiscall
MediaManager::GetType
          (MediaManager *this,
          vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_> *wanted_types)

{
  pointer ppIVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  IMedia **it;
  pointer ppIVar7;
  MediaType *wanted_type;
  int *piVar8;
  vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_> *__range2;
  
  ppIVar7 = (this->media_list_).super__Vector_base<IMedia_*,_std::allocator<IMedia_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar1 = (this->media_list_).super__Vector_base<IMedia_*,_std::allocator<IMedia_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar5 = 0;
  iVar6 = 0;
  do {
    if (ppIVar7 == ppIVar1) {
      return iVar6;
    }
    piVar2 = *(int **)(wanted_types + 8);
    for (piVar8 = *(int **)wanted_types; piVar8 != piVar2; piVar8 = piVar8 + 1) {
      iVar4 = *piVar8;
      iVar3 = (**(*ppIVar7)->_vptr_IMedia)();
      if (iVar4 == iVar3) {
        iVar4 = *piVar8;
        goto LAB_00156ff8;
      }
    }
    iVar4 = 0;
LAB_00156ff8:
    if (((iVar6 != 0) && (iVar4 != 0)) && (iVar4 != iVar6)) {
      return 0;
    }
    if (iVar4 == 3 && 1 < uVar5) {
      return 0;
    }
    uVar5 = uVar5 + 1;
    ppIVar7 = ppIVar7 + 1;
    iVar6 = iVar4;
  } while( true );
}

Assistant:

int MediaManager::GetType(std::vector<MediaType> wanted_types)
{
   int result = MEDIA_UNDEF;
   int nb_media = 0;
   for (auto& it : media_list_)
   {
      // Maybe a use of Strategy pattern would do the job
      // RULES :
      // - Do not keep unwanted types
      int local_result = MEDIA_UNDEF;
      for (auto& wanted_type : wanted_types)
      {
         if (wanted_type == it->GetType())
         {
            local_result = wanted_type;
            break;
         }
      }
      // - No mixed types
      if (result != MEDIA_UNDEF && local_result != MEDIA_UNDEF && local_result != result)
      {
         return MEDIA_UNDEF;
      }
      // - No more than 2 DISK
      if (local_result == MEDIA_DISK && nb_media >= 2)
      {
         return MEDIA_UNDEF;
      }
      else
      {
         // - Unlimited number of tracks or ROM
         // - No more than 1 of any other
      }
      result = local_result;
      nb_media++;
   }
   return result;
}